

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall DependencyScan::RecomputeDirty(DependencyScan *this,Node *node,string *err)

{
  bool bVar1;
  undefined1 local_38 [8];
  vector<Node_*,_std::allocator<Node_*>_> stack;
  string *err_local;
  Node *node_local;
  DependencyScan *this_local;
  
  stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)err;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)local_38);
  bVar1 = RecomputeDirty(this,node,(vector<Node_*,_std::allocator<Node_*>_> *)local_38,
                         (string *)
                         stack.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)local_38);
  return bVar1;
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* node, string* err) {
  vector<Node*> stack;
  return RecomputeDirty(node, &stack, err);
}